

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void writeSamples(FILE *outFile,vector<float_*,_std::allocator<float_*>_> *outChannelBufs,
                 int channels,int samples,int bytesPerSample)

{
  pointer ppfVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined1 *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar2 = samples * channels * bytesPerSample;
  uVar10 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar10 = (long)iVar2;
  }
  __ptr = operator_new__(uVar10);
  iVar4 = 0x80 << ((char)bytesPerSample * '\b' - 8U & 0x1f);
  if (0 < samples) {
    iVar5 = 2 - iVar4;
    iVar4 = iVar4 + -2;
    iVar8 = 0;
    uVar10 = 0;
    do {
      if (0 < channels) {
        ppfVar1 = (outChannelBufs->super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = 0;
        iVar9 = iVar8;
        do {
          iVar7 = (int)ppfVar1[uVar11][uVar10];
          if (iVar7 < iVar5) {
            iVar7 = iVar5;
          }
          if (iVar4 < iVar7) {
            iVar7 = iVar4;
          }
          if (0 < bytesPerSample) {
            puVar6 = (undefined1 *)((long)iVar9 + (long)__ptr);
            lVar3 = 0;
            do {
              *puVar6 = (char)(iVar7 >> ((byte)lVar3 & 0x1f));
              puVar6 = puVar6 + 1;
              lVar3 = lVar3 + 8;
            } while ((ulong)(uint)bytesPerSample << 3 != lVar3);
          }
          uVar11 = uVar11 + 1;
          iVar9 = iVar9 + bytesPerSample;
        } while (uVar11 != (uint)channels);
      }
      uVar10 = uVar10 + 1;
      iVar8 = iVar8 + bytesPerSample * channels;
    } while (uVar10 != (uint)samples);
  }
  fwrite(__ptr,1,(long)iVar2,(FILE *)outFile);
  return;
}

Assistant:

void writeSamples(FILE* outFile, std::vector<float*> outChannelBufs, int channels, int samples, int bytesPerSample){
	int ioBlockSize = channels * samples * bytesPerSample;
	uint8_t *outBufInterleaved = new uint8_t[ioBlockSize];
	int32_t maxAbsSampleVal = (0x80 << ((bytesPerSample - 1) * 8)) - 2;
	for(int i = 0; i < samples; i++){
		for(int c = 0; c < channels; c++){
			int32_t sample = (int32_t) outChannelBufs[c][i];
			sample = std::min(std::max(sample, -maxAbsSampleVal), maxAbsSampleVal);
			for(int b = 0; b < bytesPerSample; b++){
				outBufInterleaved[i * channels * bytesPerSample + c * bytesPerSample + b] = (sample >> (8 * b)) & 0xff;
			}
		}
	}
	fwrite(outBufInterleaved, 1, ioBlockSize, outFile);
}